

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O1

void __thiscall
Diligent::RefCountersImpl::ObjectWrapper<Diligent::DeviceContextVkImpl,_Diligent::IMemoryAllocator>
::DestroyObject(ObjectWrapper<Diligent::DeviceContextVkImpl,_Diligent::IMemoryAllocator> *this)

{
  DeviceContextVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this->m_pAllocator != (IMemoryAllocator *)0x0) {
    DeviceContextVkImpl::~DeviceContextVkImpl(this_00);
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])(this->m_pAllocator,this->m_pObject);
    return;
  }
  if (this_00 != (DeviceContextVkImpl *)0x0) {
    DeviceContextVkImpl::~DeviceContextVkImpl(this_00);
    free(this_00);
    return;
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }